

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O0

void __thiscall DFsScript::DFsScript(DFsScript *this)

{
  TObjPtr<DFsScript> *local_58;
  TObjPtr<DFsVariable> *local_40;
  TObjPtr<DFsSection> *local_20;
  int local_14;
  int i;
  DFsScript *this_local;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_00b8b9e0;
  local_20 = this->sections;
  do {
    TObjPtr<DFsSection>::TObjPtr(local_20);
    local_20 = local_20 + 1;
  } while ((TObjPtr<DFsVariable> *)local_20 != this->variables);
  local_40 = this->variables;
  do {
    TObjPtr<DFsVariable>::TObjPtr(local_40);
    local_40 = local_40 + 1;
  } while ((TObjPtr<DFsScript> *)local_40 != &this->parent);
  TObjPtr<DFsScript>::TObjPtr(&this->parent);
  local_58 = this->children;
  do {
    TObjPtr<DFsScript>::TObjPtr(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != (TObjPtr<DFsScript> *)&this->trigger);
  TObjPtr<AActor>::TObjPtr(&this->trigger);
  for (local_14 = 0; local_14 < 0x11; local_14 = local_14 + 1) {
    TObjPtr<DFsSection>::operator=(this->sections + local_14,(DFsSection *)0x0);
  }
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    TObjPtr<DFsVariable>::operator=(this->variables + local_14,(DFsVariable *)0x0);
  }
  for (local_14 = 0; local_14 < 0x101; local_14 = local_14 + 1) {
    TObjPtr<DFsScript>::operator=(this->children + local_14,(DFsScript *)0x0);
  }
  this->data = (char *)0x0;
  this->scriptnum = -1;
  this->len = 0;
  TObjPtr<DFsScript>::operator=(&this->parent,(DFsScript *)0x0);
  TObjPtr<AActor>::operator=(&this->trigger,(AActor *)0x0);
  this->lastiftrue = false;
  return;
}

Assistant:

DFsScript::DFsScript()
{
	int i;
	
	for(i=0; i<SECTIONSLOTS; i++) sections[i] = NULL;
	for(i=0; i<VARIABLESLOTS; i++) variables[i] = NULL;
	for(i=0; i<MAXSCRIPTS; i++)	children[i] = NULL;

	data = NULL;
	scriptnum = -1;
	len = 0;
	parent = NULL;
	trigger = NULL;
	lastiftrue = false;
}